

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O1

void __thiscall capnp::MallocMessageBuilder::~MallocMessageBuilder(MallocMessageBuilder *this)

{
  void **ppvVar1;
  RemoveConst<void_*> *ppvVar2;
  ArrayDisposer *pAVar3;
  ArrayPtr<const_capnp::word> *pAVar4;
  void **ppvVar5;
  bool bVar6;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar7;
  Fault f;
  DebugComparison<const_capnp::word_*,_void_*&> _kjCondition;
  
  (this->super_MessageBuilder)._vptr_MessageBuilder =
       (_func_int **)&PTR__MallocMessageBuilder_006fdea8;
  if (this->returnedFirstSegment == true) {
    if (this->ownFirstSegment == true) {
      free(this->firstSegment);
    }
    else {
      if ((this->super_MessageBuilder).allocatedArena == true) {
        AVar7 = capnp::_::BuilderArena::getSegmentsForOutput
                          ((BuilderArena *)(this->super_MessageBuilder).arenaSpace);
        pAVar4 = AVar7.ptr;
        bVar6 = AVar7.size_ == 0;
      }
      else {
        bVar6 = true;
        pAVar4 = (ArrayPtr<const_capnp::word> *)0x0;
      }
      if (!bVar6) {
        _kjCondition.left = pAVar4->ptr;
        _kjCondition.right = &this->firstSegment;
        _kjCondition.op.content.ptr = " == ";
        _kjCondition.op.content.size_ = 5;
        _kjCondition.result = _kjCondition.left == (word *)this->firstSegment;
        if (!_kjCondition.result) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::word_const*,void*&>&,char_const(&)[76]>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/message.c++"
                     ,0xed,FAILED,"segments[0].begin() == firstSegment",
                     "_kjCondition,\"First segment in getSegmentsForOutput() is not the first segment allocated?\""
                     ,&_kjCondition,
                     (char (*) [76])
                     "First segment in getSegmentsForOutput() is not the first segment allocated?");
          kj::_::Debug::Fault::fatal(&f);
        }
        memset((word *)this->firstSegment,0,pAVar4->size_ << 3);
      }
    }
    ppvVar1 = (this->moreSegments).builder.pos;
    for (ppvVar5 = (this->moreSegments).builder.ptr; ppvVar5 != ppvVar1; ppvVar5 = ppvVar5 + 1) {
      free(*ppvVar5);
    }
  }
  ppvVar5 = (this->moreSegments).builder.ptr;
  if (ppvVar5 != (void **)0x0) {
    ppvVar2 = (this->moreSegments).builder.pos;
    ppvVar1 = (this->moreSegments).builder.endPtr;
    (this->moreSegments).builder.ptr = (void **)0x0;
    (this->moreSegments).builder.pos = (RemoveConst<void_*> *)0x0;
    (this->moreSegments).builder.endPtr = (void **)0x0;
    pAVar3 = (this->moreSegments).builder.disposer;
    (**pAVar3->_vptr_ArrayDisposer)
              (pAVar3,ppvVar5,8,(long)ppvVar2 - (long)ppvVar5 >> 3,
               (long)ppvVar1 - (long)ppvVar5 >> 3,0);
  }
  (this->super_MessageBuilder)._vptr_MessageBuilder =
       (_func_int **)&PTR__FlatMessageBuilder_006fde58;
  if ((this->super_MessageBuilder).allocatedArena == true) {
    capnp::_::BuilderArena::~BuilderArena((BuilderArena *)(this->super_MessageBuilder).arenaSpace);
    return;
  }
  return;
}

Assistant:

MallocMessageBuilder::~MallocMessageBuilder() noexcept(false) {
  if (returnedFirstSegment) {
    if (ownFirstSegment) {
      free(firstSegment);
    } else {
      // Must zero first segment.
      kj::ArrayPtr<const kj::ArrayPtr<const word>> segments = getSegmentsForOutput();
      if (segments.size() > 0) {
        KJ_ASSERT(segments[0].begin() == firstSegment,
            "First segment in getSegmentsForOutput() is not the first segment allocated?");
        memset(firstSegment, 0, segments[0].size() * sizeof(word));
      }
    }

    for (void* ptr: moreSegments) {
      free(ptr);
    }
  }
}